

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O1

Col_Word Col_ConcatRopesA(size_t number,Col_Word *ropes)

{
  Col_Word CVar1;
  Col_Word right;
  ulong number_00;
  
  if (number == 2) {
    CVar1 = *ropes;
    right = ropes[1];
LAB_0010bb4d:
    CVar1 = Col_ConcatRopes(CVar1,right);
    return CVar1;
  }
  if (number == 1) {
    CVar1 = *ropes;
  }
  else {
    if (number != 0) {
      number_00 = number >> 1;
      CVar1 = Col_ConcatRopesA(number_00,ropes);
      right = Col_ConcatRopesA(number - number_00,ropes + number_00);
      goto LAB_0010bb4d;
    }
    CVar1 = 0;
    Col_Error(COL_VALUECHECK,ColibriDomain,0);
  }
  return CVar1;
}

Assistant:

Col_Word
Col_ConcatRopesA(
    size_t number,              /*!< Size of **ropes** array. */
    const Col_Word * ropes)     /*!< Array of ropes to concatenate in order. */
{
    size_t half;

    /*
     * Check preconditions.
     */

    /*! @valuecheck{COL_ERROR_GENERIC,number == 0} */
    VALUECHECK(number != 0, COL_ERROR_GENERIC) return WORD_NIL;

    /*
     * Quick cases.
     */

    if (number == 1) {return ropes[0];}
    if (number == 2) {return Col_ConcatRopes(ropes[0], ropes[1]);}

    /*
     * Split array and concatenate both halves. This should result in a well
     * balanced tree.
     */

    half = number/2;
    return Col_ConcatRopes(Col_ConcatRopesA(half, ropes),
            Col_ConcatRopesA(number-half, ropes+half));
}